

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.cpp
# Opt level: O0

void __thiscall
chains::ProcessorHost<boost::hana::tuple<AddModule::Processor,_MultiplyModule::Processor>_>::
setParameter(ProcessorHost<boost::hana::tuple<AddModule::Processor,_MultiplyModule::Processor>_>
             *this,int processorId,int parameterIndex,double value)

{
  anon_class_16_3_b8dd4f23 local_30;
  double local_20;
  double value_local;
  int parameterIndex_local;
  int processorId_local;
  ProcessorHost<boost::hana::tuple<AddModule::Processor,_MultiplyModule::Processor>_> *this_local;
  
  local_30.processorId = processorId;
  local_30.parameterIndex = parameterIndex;
  local_30.value = value;
  local_20 = value;
  value_local._0_4_ = parameterIndex;
  value_local._4_4_ = processorId;
  _parameterIndex_local = this;
  boost::hana::any_of_t::operator()((any_of_t *)&boost::hana::any_of,&this->processors_,&local_30);
  return;
}

Assistant:

void setParameter(const int processorId, const int parameterIndex, const double value)
  {
    hana::any_of(processors_,
      [=] (auto& processor) {
        if (processor.id() == processorId) {
          processor.parameter(parameterIndex).setValue(value);
          return true;
        }
        return false;
      });
  }